

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tester.h
# Opt level: O1

FinalStats * __thiscall
density_tests::
QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>
::FinalStats::operator+=(FinalStats *this,FinalStats *i_source)

{
  long *plVar1;
  pointer pPVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  pPVar2 = (i_source->m_counters).
           super__Vector_base<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::PutTypeCounters>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(i_source->m_counters).
                super__Vector_base<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::PutTypeCounters>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar2;
  if (lVar4 != 0) {
    lVar4 = lVar4 >> 4;
    lVar3 = *(long *)this;
    lVar4 = lVar4 + (ulong)(lVar4 == 0);
    lVar5 = 8;
    do {
      plVar1 = (long *)(lVar3 + -8 + lVar5);
      *plVar1 = *plVar1 + *(long *)((long)pPVar2 + lVar5 + -8);
      plVar1 = (long *)(lVar3 + lVar5);
      *plVar1 = *plVar1 + *(long *)((long)&pPVar2->m_existing + lVar5);
      lVar5 = lVar5 + 0x10;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  *(long *)(this + 0x18) = *(long *)(this + 0x18) + i_source->m_exceptions_during_puts;
  *(long *)(this + 0x20) = *(long *)(this + 0x20) + i_source->m_exceptions_during_consumes;
  return (FinalStats *)this;
}

Assistant:

FinalStats & operator+=(const FinalStats & i_source)
            {
                auto const count = i_source.m_counters.size();
                for (size_t i = 0; i < count; i++)
                {
                    m_counters[i].m_existing += i_source.m_counters[i].m_existing;
                    m_counters[i].m_spawned += i_source.m_counters[i].m_spawned;
                }
                m_exceptions_during_puts += i_source.m_exceptions_during_puts;
                m_exceptions_during_consumes += i_source.m_exceptions_during_consumes;
                return *this;
            }